

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_char[9]> * __thiscall
fmt::v10::make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,char_const[9]>
          (format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_char[9]>
           *__return_storage_ptr__,v10 *this,char (*args) [9])

{
  char (*args_local) [9];
  bool formattable;
  bool formattable_pointer;
  bool formattable_char;
  
  return __return_storage_ptr__;
}

Assistant:

constexpr auto make_format_args(T&... args)
    -> format_arg_store<Context, remove_cvref_t<T>...> {
  return {args...};
}